

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,DecimalQuantity *number,UnicodeString *appendTo,FieldPosition *pos,
          UErrorCode *status)

{
  int32_t offset;
  LocalizedNumberFormatter *dq;
  undefined1 local_60 [8];
  UnicodeStringAppendable appendable;
  undefined1 local_40 [8];
  FormattedNumber output;
  UErrorCode *status_local;
  FieldPosition *pos_local;
  UnicodeString *appendTo_local;
  DecimalQuantity *number_local;
  DecimalFormat *this_local;
  
  output._8_8_ = status;
  dq = LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>::operator->
                 (&(this->fields->formatter).
                   super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>);
  icu_63::number::LocalizedNumberFormatter::formatDecimalQuantity
            ((LocalizedNumberFormatter *)local_40,(DecimalQuantity *)dq,(UErrorCode *)number);
  offset = UnicodeString::length(appendTo);
  fieldPositionHelper((FormattedNumber *)local_40,pos,offset,(UErrorCode *)output._8_8_);
  UnicodeStringAppendable::UnicodeStringAppendable((UnicodeStringAppendable *)local_60,appendTo);
  icu_63::number::FormattedNumber::appendTo((FormattedNumber *)local_40,(Appendable *)local_60);
  UnicodeStringAppendable::~UnicodeStringAppendable((UnicodeStringAppendable *)local_60);
  icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)local_40);
  return appendTo;
}

Assistant:

UnicodeString&
DecimalFormat::format(const DecimalQuantity& number, UnicodeString& appendTo, FieldPosition& pos,
                      UErrorCode& status) const {
    FormattedNumber output = fields->formatter->formatDecimalQuantity(number, status);
    fieldPositionHelper(output, pos, appendTo.length(), status);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}